

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CTableFunctionBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Head_base<0UL,_duckdb::CTableBindData_*,_false> _Var1;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var2;
  CTableFunctionInfo *args;
  BinderException *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::CTableBindData_*,_false> local_98;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_90;
  CTableInternalBindInfo bind_info;
  
  local_90._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  args = (CTableFunctionInfo *)
         optional_ptr<duckdb::TableFunctionInfo,_true>::operator->(&input->info);
  make_uniq<duckdb::CTableBindData,duckdb::CTableFunctionInfo&>((duckdb *)&local_98,args);
  bind_info.bind_data =
       unique_ptr<duckdb::CTableBindData,_std::default_delete<duckdb::CTableBindData>,_true>::
       operator*((unique_ptr<duckdb::CTableBindData,_std::default_delete<duckdb::CTableBindData>,_true>
                  *)&local_98);
  bind_info.success = true;
  bind_info.error._M_dataplus._M_p = (pointer)&bind_info.error.field_2;
  bind_info.error._M_string_length = 0;
  bind_info.error.field_2._M_local_buf[0] = '\0';
  bind_info.context = context;
  bind_info.input = input;
  bind_info.return_types = return_types;
  bind_info.names = names;
  bind_info.function_info = args;
  (*args->bind)((duckdb_bind_info)&bind_info);
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       local_90._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  _Var1._M_head_impl = local_98._M_head_impl;
  if (bind_info.success != false) {
    local_98._M_head_impl = (CTableBindData *)0x0;
    *(CTableBindData **)
     local_90._M_t.
     super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
     super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var1._M_head_impl;
    ::std::__cxx11::string::~string((string *)&bind_info.error);
    if (local_98._M_head_impl != (CTableBindData *)0x0) {
      (*((local_98._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData[1])
                ();
    }
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           _Var2._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  BinderException::BinderException(this_00,&bind_info.error);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> CTableFunctionBind(ClientContext &context, TableFunctionBindInput &input,
                                            vector<LogicalType> &return_types, vector<string> &names) {
	auto &info = input.info->Cast<CTableFunctionInfo>();
	D_ASSERT(info.bind && info.function && info.init);
	auto result = make_uniq<CTableBindData>(info);
	CTableInternalBindInfo bind_info(context, input, return_types, names, *result, info);
	info.bind(ToCBindInfo(bind_info));
	if (!bind_info.success) {
		throw BinderException(bind_info.error);
	}

	return std::move(result);
}